

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckTabs.cxx
# Opt level: O0

bool __thiscall kws::Parser::CheckTabs(Parser *this)

{
  undefined1 uVar1;
  value_type *sub;
  vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *this_00;
  value_type *__x;
  Parser *in_RDI;
  smatch *currentMatch;
  Error error;
  sregex_iterator end;
  sregex_iterator currentTabIterator;
  sregex lineWithTabRegex;
  bool hasError;
  flag_type in_stack_000003c4;
  char_type *in_stack_000003c8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  undefined7 in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff70;
  match_flag_type flags;
  basic_regex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff78;
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff80;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff88;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff90;
  byte local_9;
  
  flags = (match_flag_type)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  in_RDI->m_TestsDone[10] = true;
  std::__cxx11::string::operator=
            ((string *)(in_RDI->m_TestsDescription + 10),"The file should not have any tabs");
  local_9 = 0;
  boost::xpressive::
  basic_regex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::compile(in_stack_000003c8,in_stack_000003c4);
  std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18);
  std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18);
  boost::xpressive::
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::regex_iterator(in_stack_ffffffffffffff80,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                   in_stack_ffffffffffffff78,flags);
  boost::xpressive::
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::regex_iterator((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x1af80a);
  while( true ) {
    uVar1 = boost::xpressive::operator!=
                      ((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                       (regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_ffffffffffffff18);
    if (!(bool)uVar1) break;
    ErrorStruct::ErrorStruct((ErrorStruct *)0x1af840);
    sub = boost::xpressive::
          regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator*((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)0x1af84d);
    this_00 = (vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
              boost::xpressive::
              match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::position((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)CONCAT17(uVar1,in_stack_ffffffffffffff40),(size_type)sub);
    __x = (value_type *)
          GetLineNumber(in_RDI,CONCAT17(uVar1,in_stack_ffffffffffffff40),SUB81((ulong)sub >> 0x38,0)
                       );
    std::__cxx11::string::operator=((string *)&stack0xffffffffffffff88,"Tabs identified");
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back(this_00,__x);
    local_9 = 1;
    ErrorStruct::~ErrorStruct((ErrorStruct *)0x1af8df);
    boost::xpressive::
    regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  }
  local_9 = local_9 ^ 0xff;
  boost::xpressive::
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~regex_iterator((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x1af975);
  boost::xpressive::
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~regex_iterator((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x1af982);
  boost::xpressive::
  basic_regex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_regex((basic_regex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x1af98f);
  return (bool)(local_9 & 1);
}

Assistant:

bool Parser::CheckTabs()
{
  m_TestsDone[TABS] = true;
  m_TestsDescription[TABS] = "The file should not have any tabs";

  bool hasError = false;

  sregex lineWithTabRegex = sregex::compile(R"(^[^\r\n]*?(\t)[^\r\n]*$)");
  sregex_iterator currentTabIterator(m_Buffer.begin(), m_Buffer.end(), lineWithTabRegex);
  sregex_iterator end;

  for (; currentTabIterator != end; ++currentTabIterator)
    {
    Error error;
    smatch const &currentMatch = *currentTabIterator;
    error.line   = this->GetLineNumber(currentMatch.position(1), false); 
    error.line2  = error.line;
    error.number = TABS;
    error.description = "Tabs identified";
    m_ErrorList.push_back(error);    
    hasError = true;
    }

  return !hasError;
}